

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void __thiscall
bloaty::anon_unknown_0::ElfFile::ReadSegment(ElfFile *this,Elf64_Word index,Segment *segment)

{
  uint64_t uVar1;
  long in_RDX;
  uint in_ESI;
  ElfFile *in_RDI;
  string_view sVar2;
  Elf64_Phdr *header;
  Elf64_Off n;
  char *in_stack_fffffffffffffef8;
  uint value;
  ElfFile *in_stack_ffffffffffffff00;
  Arg *this_00;
  Arg *local_e8;
  Arg *in_stack_ffffffffffffff28;
  string_view in_stack_ffffffffffffff30;
  uint64_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  undefined1 local_78 [96];
  long local_18;
  
  if ((in_RDI->header_).e_phnum <= in_ESI) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8);
    value = (uint)((ulong)local_78 >> 0x20);
    absl::substitute_internal::Arg::Arg((Arg *)in_stack_ffffffffffffff00,value);
    this_00 = (Arg *)&stack0xffffffffffffff58;
    absl::substitute_internal::Arg::Arg(this_00,(unsigned_short)(value >> 0x10));
    absl::Substitute_abi_cxx11_(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,local_e8);
    std::__cxx11::string::c_str();
    Throw((char *)this_00,value);
  }
  local_18 = in_RDX;
  sVar2 = entire_file(in_RDI);
  n = (in_RDI->header_).e_phoff;
  CheckedMul((uint64_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  uVar1 = CheckedAdd((uint64_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  (anonymous_namespace)::ElfFile::
  ReadStruct<Elf32_Phdr,Elf64_Phdr,bloaty::(anonymous_namespace)::PhdrMunger>
            (in_RDI,sVar2._M_len,sVar2._M_str,uVar1,local_18 + 0x48,in_RDX);
  if (*(long *)(in_RDX + 0x20) != 0) {
    sVar2 = GetRegion(in_stack_ffffffffffffff00,(uint64_t)in_stack_fffffffffffffef8,n);
    local_e8 = (Arg *)sVar2._M_len;
    *(Arg **)(local_18 + 0x38) = local_e8;
    *(char **)(local_18 + 0x40) = sVar2._M_str;
  }
  return;
}

Assistant:

void ElfFile::ReadSegment(Elf64_Word index, Segment* segment) const {
  if (index >= header_.e_phnum) {
    THROWF("segment $0 doesn't exist, only $1 segments", index,
           header_.e_phnum);
  }

  Elf64_Phdr* header = &segment->header_;
  ReadStruct<Elf32_Phdr>(
      entire_file(),
      CheckedAdd(header_.e_phoff, CheckedMul(header_.e_phentsize, index)),
      PhdrMunger(), &segment->range_, header);
  if (header->p_filesz > 0) {
    segment->contents_ = GetRegion(header->p_offset, header->p_filesz);
  }
}